

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

Color __thiscall nite::Color::operator*(Color *this,float c)

{
  float *in_RSI;
  undefined8 extraout_XMM0_Qa;
  float fVar1;
  Color CVar3;
  ulong uVar2;
  
  this->r = *in_RSI;
  this->g = in_RSI[1];
  this->b = in_RSI[2];
  this->a = in_RSI[3];
  rectify(this);
  this->r = this->r * c;
  this->g = this->g * c;
  fVar1 = c * this->b;
  uVar2 = (ulong)(uint)fVar1;
  this->b = fVar1;
  rectify(this);
  CVar3.b = (float)(int)uVar2;
  CVar3.a = (float)(int)(uVar2 >> 0x20);
  CVar3.r = (float)(int)extraout_XMM0_Qa;
  CVar3.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return CVar3;
}

Assistant:

nite::Color nite::Color::operator*(float c){
	auto b = *this;
	b.r *= c;
	b.g *= c;
	b.b *= c;
	b.rectify();
	return b;
}